

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O0

bool google::protobuf::compiler::csharp::SupportsPresenceApi(FieldDescriptor *descriptor)

{
  bool bVar1;
  Type TVar2;
  FileDescriptor *descriptor_00;
  bool local_19;
  FieldDescriptor *descriptor_local;
  
  bVar1 = FieldDescriptor::is_repeated(descriptor);
  if ((!bVar1) && (TVar2 = FieldDescriptor::type(descriptor), TVar2 != TYPE_MESSAGE)) {
    descriptor_00 = FieldDescriptor::file(descriptor);
    bVar1 = IsProto2(descriptor_00);
    local_19 = true;
    if (!bVar1) {
      local_19 = FieldDescriptor::has_optional_keyword(descriptor);
    }
    return local_19;
  }
  return false;
}

Assistant:

inline bool SupportsPresenceApi(const FieldDescriptor* descriptor) {
  // Unlike most languages, we don't generate Has/Clear members for message
  // types, because they can always be set to null in C#. They're not really
  // needed for oneof fields in proto2 either, as everything can be done via
  // oneof case, but we follow the convention from other languages. Proto3
  // oneof fields never have Has/Clear members - but will also never have
  // the explicit optional keyword either.
  //
  // None of the built-in helpers (descriptor->has_presence() etc) describe
  // quite the behavior we want, so the rules are explicit below.

  if (descriptor->is_repeated() ||
      descriptor->type() == FieldDescriptor::TYPE_MESSAGE) {
    return false;
  }
  // has_optional_keyword() has more complex rules for proto2, but that
  // doesn't matter given the first part of this condition.
  return IsProto2(descriptor->file()) || descriptor->has_optional_keyword();
}